

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

void Gia_ManPerformFlow2(int fIsMapped,int nAnds,int nLevels,int nLutSize,int nCutNum,int fBalance,
                        int fMinAve,int fUseMfs,int fVerbose)

{
  Abc_Frame_t *pAVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char local_fd8 [8];
  char Comm4 [1000];
  char local_be8 [8];
  char Comm3 [1000];
  char local_7f8 [8];
  char Comm2 [1000];
  char local_408 [8];
  char Comm1 [1000];
  int fBalance_local;
  int nCutNum_local;
  int nLutSize_local;
  int nLevels_local;
  int nAnds_local;
  int fIsMapped_local;
  
  Comm1._992_4_ = fBalance;
  Comm1._996_4_ = nCutNum;
  if (nLutSize == 0) {
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar3 = "";
    if (fUseMfs != 0) {
      pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_408,"&synch2 -K 6 -C 500;  &if -m%s       -C %d; %s &save",pcVar2,
            (ulong)(uint)nCutNum,pcVar3);
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar3 = "";
    if (fUseMfs != 0) {
      pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_7f8,"&dch -C 500;          &if -m%s       -C %d; %s &save",pcVar2,
            (ulong)(Comm1._996_4_ + 4),pcVar3);
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar3 = "";
    if (fUseMfs != 0) {
      pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_be8,"&synch2 -K 6 -C 500;  &lf -m%s  -E 5 -C %d; %s &save",pcVar2,
            (ulong)(uint)Comm1._996_4_,pcVar3);
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar3 = "";
    if (fUseMfs != 0) {
      pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_fd8,"&dch -C 500;          &lf -m%sk -E 5 -C %d; %s &save",pcVar2,
            (ulong)(Comm1._996_4_ + 4),pcVar3);
  }
  else {
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar3 = "";
    if (fUseMfs != 0) {
      pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_408,"&synch2 -K %d -C 500; &if -m%s       -K %d -C %d; %s &save",
            (ulong)(uint)nLutSize,pcVar2,(ulong)(uint)nLutSize,(ulong)(uint)nCutNum,pcVar3);
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar4 = "";
    if (fUseMfs != 0) {
      pcVar4 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_7f8,"&dch -C 500;          &if -m%s       -K %d -C %d; %s &save",pcVar2,
            (ulong)(uint)nLutSize,(ulong)(Comm1._996_4_ + 4),pcVar4,pcVar3);
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar3 = "";
    if (fUseMfs != 0) {
      pcVar3 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_be8,"&synch2 -K %d -C 500; &lf -m%s  -E 5 -K %d -C %d; %s &save",
            (ulong)(uint)nLutSize,pcVar2,(ulong)(uint)nLutSize,(ulong)(uint)Comm1._996_4_,pcVar3);
    pcVar2 = "";
    if (fMinAve != 0) {
      pcVar2 = "t";
    }
    pcVar4 = "";
    if (fUseMfs != 0) {
      pcVar4 = "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;";
    }
    sprintf(local_fd8,"&dch -C 500;          &lf -m%sk -E 5 -K %d -C %d; %s &save",pcVar2,
            (ulong)(uint)nLutSize,(ulong)(Comm1._996_4_ + 4),pcVar4,pcVar3);
  }
  if (fVerbose != 0) {
    printf("Trying synthesis...\n");
  }
  if (fIsMapped != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&st");
  }
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,local_408);
  if (fVerbose != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&ps");
  }
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,"&st");
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,local_7f8);
  if (fVerbose != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&ps");
  }
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,"&load");
  if (fVerbose != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&ps");
  }
  if (Comm1._992_4_ != 0) {
    if (fVerbose != 0) {
      printf("Trying SOP balancing...\n");
    }
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&st; &sopb -R 10 -C 4");
  }
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,local_be8);
  if (fVerbose != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&ps");
  }
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,"&st");
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,local_7f8);
  if (fVerbose != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&ps");
  }
  pAVar1 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar1,"&load");
  if (fVerbose != 0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&ps");
  }
  if (nAnds < 0x186a1) {
    if (Comm1._992_4_ != 0) {
      if (fVerbose != 0) {
        printf("Trying SOP balancing...\n");
      }
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,"&st; &sopb -R 10");
    }
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,local_be8);
    if (fVerbose != 0) {
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,"&ps");
    }
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&st");
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,local_7f8);
    if (fVerbose != 0) {
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,"&ps");
    }
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,"&load");
    if (fVerbose != 0) {
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,"&ps");
    }
    if (nAnds < 0xc351) {
      if (Comm1._992_4_ != 0) {
        if (fVerbose != 0) {
          printf("Trying SOP balancing...\n");
        }
        pAVar1 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar1,"&st; &sopb -R 10");
      }
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,local_be8);
      if (fVerbose != 0) {
        pAVar1 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar1,"&ps");
      }
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,"&st");
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,local_7f8);
      if (fVerbose != 0) {
        pAVar1 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar1,"&ps");
      }
      pAVar1 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar1,"&load");
      if (fVerbose != 0) {
        pAVar1 = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAVar1,"&ps");
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPerformFlow2( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fVerbose )
{
    char Comm1[1000], Comm2[1000], Comm3[1000], Comm4[1000];
    if ( nLutSize == 0 ) 
    {
        sprintf( Comm1, "&synch2 -K 6 -C 500;  &if -m%s       -C %d; %s &save", fMinAve?"t":"", nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm2, "&dch -C 500;          &if -m%s       -C %d; %s &save", fMinAve?"t":"", nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm3, "&synch2 -K 6 -C 500;  &lf -m%s  -E 5 -C %d; %s &save", fMinAve?"t":"", nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm4, "&dch -C 500;          &lf -m%sk -E 5 -C %d; %s &save", fMinAve?"t":"", nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
    }
    else
    {
        sprintf( Comm1, "&synch2 -K %d -C 500; &if -m%s       -K %d -C %d; %s &save", nLutSize, fMinAve?"t":"", nLutSize, nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm2, "&dch -C 500;          &if -m%s       -K %d -C %d; %s &save",           fMinAve?"t":"", nLutSize, nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm3, "&synch2 -K %d -C 500; &lf -m%s  -E 5 -K %d -C %d; %s &save", nLutSize, fMinAve?"t":"", nLutSize, nCutNum,   fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
        sprintf( Comm4, "&dch -C 500;          &lf -m%sk -E 5 -K %d -C %d; %s &save",           fMinAve?"t":"", nLutSize, nCutNum+4, fUseMfs ? "&put; mfs2 -W 4 -M 500 -C 7000; &get -m;":"" );
    }

    // perform synthesis
    if ( fVerbose )
        printf( "Trying synthesis...\n" );
    if ( fIsMapped )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm1 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );


    // perform balancing
    if ( fBalance )
    {
        if ( fVerbose )
            printf( "Trying SOP balancing...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb -R 10 -C 4" );
    }


    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    if ( nAnds > 100000 )
        return;


    // perform balancing
    if ( fBalance )
    {
        if ( fVerbose )
            printf( "Trying SOP balancing...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb -R 10" );
    }


    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
    if ( nAnds > 50000 )
        return;


    // perform balancing
    if ( fBalance )
    {
        if ( fVerbose )
            printf( "Trying SOP balancing...\n" );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st; &sopb -R 10" );
    }


    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm3 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // perform synthesis
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&st" );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Comm2 );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );

    // return the result
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&load" );
    if ( fVerbose )
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "&ps" );
}